

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
          (BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,HashedCharacterBuffer<char16_t> **key,PropertyRecord **value)

{
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  char *addr;
  hash_t hashCode;
  undefined8 *puVar2;
  HashedCharacterBuffer<char16_t> *pHVar3;
  char16_t *string2;
  PropertyRecord *pPVar4;
  long lVar5;
  code *pcVar6;
  long lVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  undefined4 *puVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  char *addr_00;
  PropertyRecord *local_68;
  HashedCharacterBuffer<char16_t> *local_60;
  PropertyRecord **local_58;
  long local_50;
  long local_48;
  ulong local_40;
  uint local_34;
  
  lVar15 = *(long *)this;
  local_58 = value;
  if (lVar15 == 0) {
    BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar15 = *(long *)this;
  }
  hashCode = *(int *)&((*key)->super_CharacterBuffer<char16_t>).field_0xc * 2 + 1;
  local_40 = CONCAT44(local_40._4_4_,hashCode);
  local_34 = BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar14 = *(uint *)(lVar15 + (ulong)local_34 * 4);
  if ((int)uVar14 < 0) {
    cVar8 = (char)(uVar14 >> 0x18);
    uVar13 = 0;
  }
  else {
    lVar15 = *(long *)(this + 8);
    uVar13 = 0;
    do {
      puVar2 = *(undefined8 **)(lVar15 + 0x10 + (ulong)uVar14 * 0x18);
      pHVar3 = *key;
      if ((*(uint *)(puVar2 + 1) == (pHVar3->super_CharacterBuffer<char16_t>).len) &&
         (*(int *)((long)puVar2 + 0xc) ==
          *(int *)&(pHVar3->super_CharacterBuffer<char16_t>).field_0xc)) {
        string2 = (pHVar3->super_CharacterBuffer<char16_t>).string.ptr;
        if (((char16_t *)*puVar2 == string2) ||
           (iVar10 = PAL_wmemcmp((char16_t *)*puVar2,string2,(ulong)*(uint *)(puVar2 + 1)),
           iVar10 == 0)) {
          if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar13);
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3b2,"(op != Insert_Add)","op != Insert_Add");
          if (bVar9) {
            *puVar11 = 0;
            return -1;
          }
          goto LAB_007d407d;
        }
      }
      uVar13 = uVar13 + 1;
      uVar14 = *(uint *)(lVar15 + (ulong)uVar14 * 0x18 + 8);
    } while (-1 < (int)uVar14);
    cVar8 = (char)(uVar14 >> 0x18);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar13);
  }
  iVar10 = -1;
  if (cVar8 < '\0') {
    if (*(int *)(this + 0x28) == 0) {
      uVar14 = *(uint *)(this + 0x20);
      if (uVar14 == *(uint *)(this + 0x18)) {
        BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Resize((BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this);
        local_34 = BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ::GetBucket((hash_t)local_40,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
        uVar14 = *(uint *)(this + 0x20);
      }
      uVar12 = (ulong)uVar14;
      *(uint *)(this + 0x20) = uVar14 + 1;
      if (*(int *)(this + 0x18) < (int)(uVar14 + 1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f1,"(count <= size)","count <= size");
        if (!bVar9) goto LAB_007d407d;
        *puVar11 = 0;
      }
      if (*(int *)(this + 0x18) <= (int)uVar14) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f2,"(index < size)","index < size");
        if (!bVar9) goto LAB_007d407d;
        *puVar11 = 0;
      }
    }
    else {
      if (*(int *)(this + 0x28) < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d4,"(freeCount > 0)","freeCount > 0");
        if (!bVar9) goto LAB_007d407d;
        *puVar11 = 0;
      }
      if (*(int *)(this + 0x24) < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d5,"(freeList >= 0)","freeList >= 0");
        if (!bVar9) goto LAB_007d407d;
        *puVar11 = 0;
      }
      if (*(int *)(this + 0x20) <= *(int *)(this + 0x24)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d6,"(freeList < count)","freeList < count");
        if (!bVar9) {
LAB_007d407d:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar11 = 0;
      }
      uVar12 = (ulong)*(uint *)(this + 0x24);
      pBVar1 = this + 0x28;
      *(int *)pBVar1 = *(int *)pBVar1 + -1;
      if (*(int *)pBVar1 != 0) {
        iVar10 = BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetNextFreeEntryIndex
                           ((EntryType *)
                            ((long)(int)*(uint *)(this + 0x24) * 0x18 + *(long *)(this + 8)));
        *(int *)(this + 0x24) = iVar10;
      }
    }
    local_48 = *(long *)(this + 8);
    local_50 = (long)(int)uVar12;
    lVar7 = local_50 * 0x18;
    addr = (char *)(local_48 + lVar7);
    pHVar3 = *key;
    local_40 = uVar12;
    Memory::Recycler::WBSetBit((char *)&local_60);
    local_60 = pHVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
    pPVar4 = *local_58;
    Memory::Recycler::WBSetBit((char *)&local_68);
    local_68 = pPVar4;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_68);
    pPVar4 = local_68;
    Memory::Recycler::WBSetBit(addr);
    addr_00 = (char *)((undefined8 *)(local_48 + lVar7) + 2);
    *(undefined8 *)(local_48 + lVar7) = pPVar4;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    pHVar3 = local_60;
    Memory::Recycler::WBSetBit(addr_00);
    uVar12 = local_40;
    *(HashedCharacterBuffer<char16_t> **)addr_00 = pHVar3;
    iVar10 = (int)local_40;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
    lVar15 = *(long *)this;
    lVar5 = *(long *)(this + 8);
    *(undefined4 *)(lVar5 + 8 + lVar7) = *(undefined4 *)(lVar15 + (ulong)local_34 * 4);
    *(int *)(lVar15 + (ulong)local_34 * 4) = (int)local_50;
    uVar13 = 0;
    uVar12 = uVar12 & 0xffffffff;
    do {
      uVar14 = *(uint *)(lVar5 + 8 + (long)(int)uVar12 * 0x18);
      uVar12 = (ulong)uVar14;
      uVar13 = uVar13 + 1;
    } while (uVar14 != 0xffffffff);
    if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
      DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar13);
    }
  }
  return iVar10;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }